

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
TestCharReaderTestparseWithStackLimit::TestCharReaderTestparseWithStackLimit
          (TestCharReaderTestparseWithStackLimit *this)

{
  CharReaderTest::CharReaderTest(&this->super_CharReaderTest);
  (this->super_CharReaderTest).super_TestCase._vptr_TestCase = (_func_int **)&PTR__TestCase_00165358
  ;
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderTest, parseWithStackLimit) {
  Json::CharReaderBuilder b;
  Json::Value root;
  char const doc[] =
      "{ \"property\" : \"value\" }";
  {
  b.settings_["stackLimit"] = 2;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(ok);
  JSONTEST_ASSERT(errs == "");
  JSONTEST_ASSERT_EQUAL("value", root["property"]);
  delete reader;
  }
  {
  b.settings_["stackLimit"] = 1;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  JSONTEST_ASSERT_THROWS(reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs));
  delete reader;
  }
}